

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blockers_triangles_iterators.h
# Opt level: O0

bool __thiscall
Gudhi::skeleton_blocker::
Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
::finished(Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
           *this)

{
  element_type *this_00;
  type_conflict1 local_59;
  iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
  local_58;
  Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>
  local_28;
  Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  *local_10;
  Triangle_around_vertex_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>,_Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>_>
  *this_local;
  
  local_59 = true;
  if ((this->is_end_ & 1U) == 0) {
    local_10 = this;
    this_00 = std::
              __shared_ptr_access<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Gudhi::skeleton_blocker::Skeleton_blocker_link_complex<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->link_);
    Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::edge_range
              ((Complex_edge_range *)&local_58,
               (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *)
               this_00);
    boost::iterator_range_detail::
    iterator_range_base<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_boost::iterators::incrementable_traversal_tag>
    ::end(&local_28,&local_58);
    local_59 = boost::iterators::operator==
                         ((iterator_facade<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                           *)&this->current_edge_,
                          (iterator_facade<Gudhi::skeleton_blocker::Edge_iterator<Gudhi::skeleton_blocker::Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>_>,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_boost::iterators::forward_traversal_tag,_const_boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_long>
                           *)&local_28);
  }
  return local_59;
}

Assistant:

bool finished() const {
    return is_end_ || (current_edge_ == link_->edge_range().end());
  }